

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::GenerateStaticVariablesInitialization
          (ExtensionGenerator *this,Printer *printer)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined8 uVar1;
  bool bVar2;
  ObjectiveCType OVar3;
  Descriptor *pDVar4;
  EnumDescriptor *this_00;
  AlphaNum *in_RCX;
  Descriptor *descriptor;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  EnumDescriptor *descriptor_00;
  FieldDescriptor *field_01;
  Descriptor *descriptor_01;
  string_view class_name;
  string_view class_name_00;
  Sub *local_d00;
  basic_string_view<char,_std::char_traits<char>_> local_bf0;
  undefined1 local_bdc;
  byte local_bdb;
  allocator<char> local_bda;
  byte local_bd9;
  string local_bd8;
  undefined1 local_bb8 [16];
  string local_ba8;
  allocator<char> local_b81;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  string local_b38;
  allocator<char> local_b11;
  string local_b10;
  int local_af0;
  allocator<char> local_ae9;
  string local_ae8;
  allocator<char> local_ac1;
  string local_ac0;
  string local_aa0;
  AlphaNum local_a80;
  AlphaNum local_a50;
  string local_a20;
  allocator<char> local_9f9;
  string local_9f8;
  undefined1 local_9d8 [16];
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  byte local_97a;
  allocator<char> local_979;
  AlphaNum local_978;
  byte local_941;
  string local_940;
  AlphaNum local_920;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  string local_8a8;
  allocator<char> local_881;
  string local_880;
  byte local_85a;
  allocator<char> local_859;
  string local_858;
  allocator<char> local_831;
  string local_830;
  Sub *local_810;
  Sub local_808;
  Sub local_750;
  Sub local_698;
  Sub local_5e0;
  Sub local_528;
  Sub local_470;
  Sub local_3b8;
  Sub local_300;
  Sub local_248;
  Sub local_190;
  iterator local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_c8;
  allocator<char> local_b1;
  value_type local_b0;
  allocator<char> local_89;
  value_type local_88;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  undefined1 local_38 [4];
  ObjectiveCType objc_type;
  string containing_type;
  Printer *printer_local;
  ExtensionGenerator *this_local;
  
  containing_type.field_2._8_8_ = printer;
  pDVar4 = FieldDescriptor::containing_type(this->descriptor_);
  ClassName_abi_cxx11_((string *)local_38,(objectivec *)pDVar4,descriptor);
  OVar3 = GetObjectiveCType(this->descriptor_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68);
  bVar2 = FieldDescriptor::is_repeated(this->descriptor_);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"GPBExtensionRepeated",&local_89);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  bVar2 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"GPBExtensionPacked",&local_b1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  uVar1 = containing_type.field_2._8_8_;
  local_bdc = 1;
  local_810 = &local_808;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"default",&local_831);
  local_85a = 0;
  bVar2 = FieldDescriptor::is_repeated(this->descriptor_);
  if (bVar2) {
    std::allocator<char>::allocator();
    local_85a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"nil",&local_859);
  }
  else {
    DefaultValue_abi_cxx11_(&local_858,(objectivec *)this->descriptor_,field);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_808,&local_830,&local_858);
  local_810 = &local_750;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"default_name",&local_881)
  ;
  GPBGenericValueFieldName_abi_cxx11_(&local_8a8,(objectivec *)this->descriptor_,field_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_750,&local_880,&local_8a8);
  local_810 = &local_698;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"enum_desc_func_name",&local_8c9);
  local_941 = 0;
  local_97a = 0;
  if (OVar3 == OBJECTIVECTYPE_ENUM) {
    this_00 = FieldDescriptor::enum_type(this->descriptor_);
    EnumName_abi_cxx11_(&local_940,(objectivec *)this_00,descriptor_00);
    local_941 = 1;
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_920,&local_940);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_978,"_EnumDescriptor");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_8f0,(lts_20250127 *)&local_920,&local_978,in_RCX);
  }
  else {
    std::allocator<char>::allocator();
    local_97a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"NULL",&local_979);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_698,&local_8c8,&local_8f0);
  local_810 = &local_5e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,"extended_type",&local_9a1);
  local_9d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
  class_name._M_len = local_9d8._8_8_;
  class_name._M_str = (char *)in_RCX;
  ObjCClass_abi_cxx11_(&local_9c8,local_9d8._0_8_,class_name);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_5e0,&local_9a0,&local_9c8);
  local_810 = &local_528;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f8,"extension_type",&local_9f9);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_a50,"GPBDataType");
  GetCapitalizedType_abi_cxx11_(&local_aa0,(objectivec *)this->descriptor_,field_01);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_a80,&local_aa0);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_a20,(lts_20250127 *)&local_a50,&local_a80,in_RCX);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_528,&local_9f8,&local_a20);
  local_810 = &local_470;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac0,"method_name",&local_ac1);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_470,&local_ac0,&this->method_name_);
  local_810 = &local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae8,"number",&local_ae9);
  local_af0 = FieldDescriptor::number(this->descriptor_);
  io::Printer::Sub::Sub<int>(&local_3b8,&local_ae8,&local_af0);
  local_810 = &local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b10,"options",&local_b11);
  BuildFlagsString(&local_b38,FLAGTYPE_EXTENSION,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_300,&local_b10,&local_b38);
  local_810 = &local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,"root_or_message_class_name",&local_b59);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>
            (&local_248,&local_b58,&this->root_or_message_class_name_);
  local_810 = &local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b80,"type",&local_b81);
  local_bd9 = 0;
  local_bdb = 0;
  if (OVar3 == OBJECTIVECTYPE_MESSAGE) {
    pDVar4 = FieldDescriptor::message_type(this->descriptor_);
    ClassName_abi_cxx11_(&local_bd8,(objectivec *)pDVar4,descriptor_01);
    local_bd9 = 1;
    local_bb8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_bd8);
    class_name_00._M_len = local_bb8._8_8_;
    class_name_00._M_str = (char *)in_RCX;
    ObjCClass_abi_cxx11_(&local_ba8,local_bb8._0_8_,class_name_00);
  }
  else {
    std::allocator<char>::allocator();
    local_bdb = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba8,"Nil",&local_bda);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_190,&local_b80,&local_ba8);
  local_bdc = 0;
  local_d8 = &local_808;
  local_d0 = 10;
  v._M_len = 10;
  v._M_array = local_d8;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_c8._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_bf0,
             "\n        {\n          .defaultValue.$default_name$ = $default$,\n          .singletonName = GPBStringifySymbol($root_or_message_class_name$) \"_$method_name$\",\n          .extendedClass.clazz = $extended_type$,\n          .messageOrGroupClass.clazz = $type$,\n          .enumDescriptorFunc = $enum_desc_func_name$,\n          .fieldNumber = $number$,\n          .dataType = $extension_type$,\n          .options = $options$,\n        },\n      "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar1,local_c8._M_allocated_capacity,local_c8._8_8_,local_bf0._M_len,
                    local_bf0._M_str);
  local_d00 = (Sub *)&local_d8;
  do {
    local_d00 = local_d00 + -1;
    io::Printer::Sub::~Sub(local_d00);
  } while (local_d00 != &local_808);
  std::__cxx11::string::~string((string *)&local_ba8);
  if ((local_bdb & 1) != 0) {
    std::allocator<char>::~allocator(&local_bda);
  }
  if ((local_bd9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_bd8);
  }
  std::__cxx11::string::~string((string *)&local_b80);
  std::allocator<char>::~allocator(&local_b81);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator(&local_b11);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::allocator<char>::~allocator(&local_ae9);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::allocator<char>::~allocator(&local_ac1);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::allocator<char>::~allocator(&local_9f9);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::__cxx11::string::~string((string *)&local_8f0);
  if ((local_97a & 1) != 0) {
    std::allocator<char>::~allocator(&local_979);
  }
  if ((local_941 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_940);
  }
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  std::__cxx11::string::~string((string *)&local_858);
  if ((local_85a & 1) != 0) {
    std::allocator<char>::~allocator(&local_859);
  }
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ExtensionGenerator::GenerateStaticVariablesInitialization(
    io::Printer* printer) const {
  const std::string containing_type = ClassName(descriptor_->containing_type());
  ObjectiveCType objc_type = GetObjectiveCType(descriptor_);

  std::vector<std::string> options;
  if (descriptor_->is_repeated()) options.push_back("GPBExtensionRepeated");
  if (descriptor_->is_packed()) options.push_back("GPBExtensionPacked");

  printer->Emit(
      {{"default",
        descriptor_->is_repeated() ? "nil" : DefaultValue(descriptor_)},
       {"default_name", GPBGenericValueFieldName(descriptor_)},
       {"enum_desc_func_name",
        objc_type == OBJECTIVECTYPE_ENUM
            ? absl::StrCat(EnumName(descriptor_->enum_type()),
                           "_EnumDescriptor")
            : "NULL"},
       {"extended_type", ObjCClass(containing_type)},
       {"extension_type",
        absl::StrCat("GPBDataType", GetCapitalizedType(descriptor_))},
       {"method_name", method_name_},
       {"number", descriptor_->number()},
       {"options", BuildFlagsString(FLAGTYPE_EXTENSION, options)},
       {"root_or_message_class_name", root_or_message_class_name_},
       {"type", objc_type == OBJECTIVECTYPE_MESSAGE
                    ? ObjCClass(ClassName(descriptor_->message_type()))
                    : "Nil"}},
      R"objc(
        {
          .defaultValue.$default_name$ = $default$,
          .singletonName = GPBStringifySymbol($root_or_message_class_name$) "_$method_name$",
          .extendedClass.clazz = $extended_type$,
          .messageOrGroupClass.clazz = $type$,
          .enumDescriptorFunc = $enum_desc_func_name$,
          .fieldNumber = $number$,
          .dataType = $extension_type$,
          .options = $options$,
        },
      )objc");
}